

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> *
read_file_u32(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
             string *file_name)

{
  pointer pcVar1;
  int iVar2;
  FILE *__stream;
  long __off;
  long lVar3;
  size_t sVar4;
  char *format;
  ulong __new_size;
  string local_40;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar1 = (file_name->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + file_name->_M_string_length);
  __stream = (FILE *)fopen_or_fail(&local_40,"rb");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  __off = ftell(__stream);
  fseek(__stream,0,2);
  lVar3 = ftell(__stream);
  if ((lVar3 - __off & 3U) == 0) {
    __new_size = (ulong)(lVar3 - __off) >> 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (__return_storage_ptr__,__new_size);
    fseek(__stream,__off,0);
    sVar4 = fread((__return_storage_ptr__->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start,4,__new_size,__stream);
    if (sVar4 != __new_size) {
      quit("reading file content failed: %d",sVar4);
    }
    iVar2 = fclose(__stream);
    if (iVar2 == 0) {
      return __return_storage_ptr__;
    }
    format = "closing file failed";
  }
  else {
    format = "reading file content failed: file size % 32bit != 0";
  }
  quit(format);
}

Assistant:

std::vector<uint32_t> read_file_u32(std::string file_name)
{
    std::vector<uint32_t> content;
    auto f = fopen_or_fail(file_name, "rb");
    auto cur = ftell(f);
    fseek(f, 0, SEEK_END);
    auto end = ftell(f);
    size_t file_size = (end - cur);
    size_t file_size_u32 = file_size / sizeof(uint32_t);
    if (file_size % sizeof(uint32_t) != 0) {
        quit("reading file content failed: file size % 32bit != 0");
    }
    content.resize(file_size_u32);
    fseek(f, cur, SEEK_SET);
    size_t ret = fread(content.data(), sizeof(uint32_t), file_size_u32, f);
    if (ret != file_size_u32) {
        quit("reading file content failed: %d", ret);
    }
    fclose_or_fail(f);
    return content;
}